

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

container_t * convert_run_optimize(container_t *c,uint8_t typecode_original,uint8_t *typecode_after)

{
  uint uVar1;
  ulong *puVar2;
  rle16_t *prVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int32_t size;
  uint uVar7;
  int iVar8;
  run_container_t *prVar9;
  long lVar10;
  ushort uVar11;
  long lVar12;
  undefined7 in_register_00000031;
  ulong uVar13;
  uint uVar14;
  
  iVar8 = (int)CONCAT71(in_register_00000031,typecode_original);
  prVar9 = (run_container_t *)c;
  if (iVar8 == 2) {
    size = array_container_number_of_runs((array_container_t *)c);
    uVar1 = *c;
    if (size * 4 < (int)(uVar1 * 2)) {
      prVar9 = run_container_create_given_capacity(size);
      if ((int)uVar1 < 1) {
        uVar7 = 0xfffffffe;
        uVar14 = 0xffffffff;
      }
      else {
        lVar10 = *(long *)((long)c + 8);
        uVar14 = 0xffffffff;
        uVar7 = 0xfffffffe;
        uVar13 = 0;
        do {
          uVar11 = *(ushort *)(lVar10 + uVar13 * 2);
          if (uVar7 + 1 == (uint)uVar11) {
            uVar5 = (uint)uVar11;
            uVar6 = uVar14;
          }
          else {
            uVar5 = (uint)uVar11;
            uVar6 = (uint)uVar11;
            if (uVar14 != 0xffffffff) {
              prVar3 = prVar9->runs;
              iVar8 = prVar9->n_runs;
              prVar3[iVar8].value = (uint16_t)uVar14;
              prVar3[iVar8].length = (short)uVar7 - (uint16_t)uVar14;
              prVar9->n_runs = iVar8 + 1;
              uVar5 = (uint)*(ushort *)(lVar10 + uVar13 * 2);
            }
          }
          uVar14 = uVar6;
          uVar7 = uVar5;
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
      prVar3 = prVar9->runs;
      iVar8 = prVar9->n_runs;
      prVar3[iVar8].value = (uint16_t)uVar14;
      prVar3[iVar8].length = (short)uVar7 - (uint16_t)uVar14;
      prVar9->n_runs = iVar8 + 1;
      *typecode_after = '\x03';
      array_container_free((array_container_t *)c);
    }
    else {
      *typecode_after = '\x02';
    }
  }
  else if (iVar8 == 3) {
    prVar9 = (run_container_t *)
             convert_run_to_efficient_container((run_container_t *)c,typecode_after);
    if (prVar9 != (run_container_t *)c) {
      container_free(c,'\x03');
    }
  }
  else {
    iVar8 = bitset_container_number_of_runs((bitset_container_t *)c);
    if (iVar8 * 4 + 2 < 0x2000) {
      prVar9 = run_container_create_given_capacity(iVar8);
      puVar2 = *(ulong **)((long)c + 8);
      uVar13 = *puVar2;
      lVar10 = 0;
      do {
        if ((uVar13 == 0) && ((int)lVar10 < 0x3ff)) {
          lVar12 = (long)(int)lVar10;
          do {
            lVar10 = lVar12 + 1;
            uVar13 = puVar2[lVar12 + 1];
            if (uVar13 != 0) break;
            bVar4 = lVar12 < 0x3fe;
            lVar12 = lVar10;
          } while (bVar4);
        }
        if (uVar13 == 0) goto LAB_0010e7d2;
        lVar12 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        iVar8 = (int)lVar10;
        uVar11 = (ushort)(iVar8 << 6) | (ushort)lVar12;
        uVar13 = uVar13 - 1 | uVar13;
        if ((uVar13 == 0xffffffffffffffff) && (iVar8 < 0x3ff)) {
          lVar12 = (long)iVar8;
          do {
            lVar10 = lVar12 + 1;
            uVar13 = puVar2[lVar12 + 1];
            if (uVar13 != 0xffffffffffffffff) break;
            bVar4 = lVar12 < 0x3fe;
            lVar12 = lVar10;
          } while (bVar4);
        }
        if (uVar13 == 0xffffffffffffffff) {
          prVar3 = prVar9->runs;
          iVar8 = prVar9->n_runs;
          prVar3[iVar8].value = uVar11;
          prVar3[iVar8].length = ((short)lVar10 * 0x40 - uVar11) + 0x3f;
          prVar9->n_runs = iVar8 + 1;
LAB_0010e7d2:
          bitset_container_free((bitset_container_t *)c);
          *typecode_after = '\x03';
          return prVar9;
        }
        lVar12 = 0;
        if (~uVar13 != 0) {
          for (; (~uVar13 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        prVar3 = prVar9->runs;
        iVar8 = prVar9->n_runs;
        prVar3[iVar8].value = uVar11;
        prVar3[iVar8].length = ~uVar11 + (short)((int)lVar10 << 6) + (short)lVar12;
        prVar9->n_runs = iVar8 + 1;
        uVar13 = uVar13 + 1 & uVar13;
      } while( true );
    }
    *typecode_after = '\x01';
  }
  return prVar9;
}

Assistant:

container_t *convert_run_optimize(container_t *c, uint8_t typecode_original,
                                  uint8_t *typecode_after) {
    if (typecode_original == RUN_CONTAINER_TYPE) {
        container_t *newc =
            convert_run_to_efficient_container(CAST_run(c), typecode_after);
        if (newc != c) {
            container_free(c, typecode_original);
        }
        return newc;
    } else if (typecode_original == ARRAY_CONTAINER_TYPE) {
        // it might need to be converted to a run container.
        array_container_t *c_qua_array = CAST_array(c);
        int32_t n_runs = array_container_number_of_runs(c_qua_array);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t card = array_container_cardinality(c_qua_array);
        int32_t size_as_array_container =
            array_container_serialized_size_in_bytes(card);

        if (size_as_run_container >= size_as_array_container) {
            *typecode_after = ARRAY_CONTAINER_TYPE;
            return c;
        }
        // else convert array to run container
        run_container_t *answer = run_container_create_given_capacity(n_runs);
        int prev = -2;
        int run_start = -1;

        assert(card > 0);
        for (int i = 0; i < card; ++i) {
            uint16_t cur_val = c_qua_array->array[i];
            if (cur_val != prev + 1) {
                // new run starts; flush old one, if any
                if (run_start != -1) add_run(answer, run_start, prev);
                run_start = cur_val;
            }
            prev = c_qua_array->array[i];
        }
        assert(run_start >= 0);
        // now prev is the last seen value
        add_run(answer, run_start, prev);
        *typecode_after = RUN_CONTAINER_TYPE;
        array_container_free(c_qua_array);
        return answer;
    } else if (typecode_original ==
               BITSET_CONTAINER_TYPE) {  // run conversions on bitset
        // does bitset need conversion to run?
        bitset_container_t *c_qua_bitset = CAST_bitset(c);
        int32_t n_runs = bitset_container_number_of_runs(c_qua_bitset);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t size_as_bitset_container =
            bitset_container_serialized_size_in_bytes();

        if (size_as_bitset_container <= size_as_run_container) {
            // no conversion needed.
            *typecode_after = BITSET_CONTAINER_TYPE;
            return c;
        }
        // bitset to runcontainer (ported from Java  RunContainer(
        // BitmapContainer bc, int nbrRuns))
        assert(n_runs > 0);  // no empty bitmaps
        run_container_t *answer = run_container_create_given_capacity(n_runs);

        int long_ctr = 0;
        uint64_t cur_word = c_qua_bitset->words[0];
        while (true) {
            while (cur_word == UINT64_C(0) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word = c_qua_bitset->words[++long_ctr];

            if (cur_word == UINT64_C(0)) {
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }

            int local_run_start = roaring_trailing_zeroes(cur_word);
            int run_start = local_run_start + 64 * long_ctr;
            uint64_t cur_word_with_1s = cur_word | (cur_word - 1);

            int run_end = 0;
            while (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word_with_1s = c_qua_bitset->words[++long_ctr];

            if (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF)) {
                run_end = 64 + long_ctr * 64;  // exclusive, I guess
                add_run(answer, run_start, run_end - 1);
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }
            int local_run_end = roaring_trailing_zeroes(~cur_word_with_1s);
            run_end = local_run_end + long_ctr * 64;
            add_run(answer, run_start, run_end - 1);
            cur_word = cur_word_with_1s & (cur_word_with_1s + 1);
        }
        return answer;
    } else {
        assert(false);
        roaring_unreachable;
        return NULL;
    }
}